

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsFortranBuildingInstrinsicModules(cmGeneratorTarget *this)

{
  byte bVar1;
  cmValue cVar2;
  string *extraout_RAX;
  cmValue cVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  string_view value;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Fortran_BUILDING_INSTRINSIC_MODULES","");
  cVar2 = GetProperty(this,&local_38);
  cVar3 = cVar2;
  pcVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    cVar3.Value = extraout_RAX;
    pcVar4 = extraout_RDX_00;
  }
  bVar1 = (byte)cVar3.Value;
  if (cVar2.Value != (string *)0x0) {
    value._M_str = pcVar4;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
  }
  return (bool)(cVar2.Value != (string *)0x0 & bVar1);
}

Assistant:

bool cmGeneratorTarget::IsFortranBuildingInstrinsicModules() const
{
  if (cmValue prop =
        this->GetProperty("Fortran_BUILDING_INSTRINSIC_MODULES")) {
    return cmIsOn(*prop);
  }
  return false;
}